

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UResourceBundle *
ures_getByKeyWithFallback_63
          (UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  ResourceData *pResData;
  bool bVar1;
  char cVar2;
  uint table;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  UResourceBundle *resB_00;
  char *__s2;
  UErrorCode UVar6;
  Resource resource;
  UResourceDataEntry *realData;
  Resource RVar7;
  Resource r;
  char *pcVar8;
  UResourceBundle *pUVar9;
  int local_cc;
  char *myPath;
  UResourceBundle *local_c0;
  UErrorCode errorCode;
  char *local_b0;
  UResourceBundle *local_a8;
  char *local_a0;
  char *key;
  int32_t local_90;
  int32_t t;
  CharString path;
  StringPiece local_40;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      table = resB->fRes;
      if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
        local_c0 = fillIn;
        icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
        path.len = 0;
        *path.buffer.ptr = '\0';
        errorCode = U_ZERO_ERROR;
        local_b0 = inKey;
        icu_63::StringPiece::StringPiece((StringPiece *)&key,inKey);
        icu_63::CharString::append(&path,key,local_90,&errorCode);
        pResData = &resB->fResData;
        RVar7 = 0xffffffff;
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          cVar2 = *path.buffer.ptr;
          local_a8 = resB;
          if (table != 0xffffffff && cVar2 != '\0') {
            pcVar8 = path.buffer.ptr;
            while (((table & 0xf0000000) == 0x20000000 || ((table & 0xe0000000) == 0x40000000))) {
              pcVar4 = strchr(pcVar8,0x2f);
              if (pcVar4 == (char *)0x0) {
                sVar5 = strlen(pcVar8);
                pcVar4 = pcVar8 + sVar5;
              }
              else {
                *pcVar4 = '\0';
                pcVar4 = pcVar4 + 1;
              }
              myPath = pcVar8;
              table = res_getTableItemByKey_63(pResData,table,&t,&myPath);
              cVar2 = *pcVar4;
              if ((cVar2 == '\0') || (pcVar8 = pcVar4, table == 0xffffffff)) break;
            }
          }
          RVar7 = -(uint)(cVar2 != '\0') | table;
          resB = local_a8;
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
        pUVar9 = local_c0;
        key = local_b0;
        realData = resB->fData;
        if (RVar7 == 0xffffffff) {
          icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
          path.len = 0;
          *path.buffer.ptr = '\0';
          myPath = (char *)0x0;
          local_a0 = resB->fResPath;
          local_cc = resB->fResPathLen;
          resB_00 = (UResourceBundle *)0x0;
          local_a8 = resB;
          do {
            realData = realData->fParent;
            if (realData == (UResourceDataEntry *)0x0) {
              *status = U_MISSING_RESOURCE_ERROR;
              bVar1 = true;
              fillIn = local_c0;
              goto LAB_002ebdcf;
            }
            RVar7 = 0xffffffff;
            if (realData->fBogus == U_ZERO_ERROR) {
              r = (realData->fData).rootRes;
              path.len = 0;
              *path.buffer.ptr = '\0';
              if (0 < local_cc) {
                icu_63::CharString::append(&path,local_a0,local_cc,status);
              }
              icu_63::StringPiece::StringPiece(&local_40,local_b0);
              icu_63::CharString::append(&path,local_40.ptr_,local_40.length_,status);
              if (U_ZERO_ERROR < *status) {
                ures_closeBundle(resB_00,'\x01');
                bVar1 = false;
                fillIn = local_c0;
                goto LAB_002ebdcf;
              }
              myPath = path.buffer.ptr;
              key = local_b0;
              do {
                RVar7 = res_findResource_63(&realData->fData,r,&myPath,&key);
                if (((RVar7 & 0xf0000000) == 0x30000000) && (*myPath != '\0')) {
                  resB_00 = init_resb_result(&realData->fData,RVar7,(char *)0x0,-1,realData,local_a8
                                             ,0,resB_00,status);
                  if (resB_00 == (UResourceBundle *)0x0) {
                    resB_00 = (UResourceBundle *)0x0;
                    break;
                  }
                  realData = resB_00->fData;
                  local_a0 = resB_00->fResPath;
                  r = resB_00->fRes;
                  local_cc = resB_00->fResPathLen;
                }
              } while (*myPath != '\0');
            }
          } while (RVar7 == 0xffffffff);
          pcVar8 = realData->fName;
          __s2 = uloc_getDefault_63();
          pcVar4 = local_b0;
          iVar3 = strcmp(pcVar8,__s2);
          if (iVar3 == 0) {
            UVar6 = U_USING_DEFAULT_WARNING;
          }
          else {
            iVar3 = strcmp(realData->fName,"root");
            UVar6 = (uint)(iVar3 == 0) | U_ERROR_WARNING_START;
          }
          *status = UVar6;
          fillIn = init_resb_result(&realData->fData,RVar7,pcVar4,-1,realData,local_a8,0,local_c0,
                                    status);
          bVar1 = true;
LAB_002ebdcf:
          pUVar9 = local_c0;
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
        }
        else {
          fillIn = init_resb_result(pResData,RVar7,local_b0,-1,realData,resB,0,local_c0,status);
          bVar1 = true;
          resB_00 = (UResourceBundle *)0x0;
        }
        if (!bVar1) {
          return pUVar9;
        }
      }
      else {
        *status = U_RESOURCE_TYPE_MISMATCH;
        resB_00 = (UResourceBundle *)0x0;
      }
      ures_closeBundle(resB_00,'\x01');
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 
ures_getByKeyWithFallback(const UResourceBundle *resB, 
                          const char* inKey, 
                          UResourceBundle *fillIn, 
                          UErrorCode *status) {
    Resource res = RES_BOGUS, rootRes = RES_BOGUS;
    /*UResourceDataEntry *realData = NULL;*/
    UResourceBundle *helper = NULL;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        res = getTableItemByKeyPath(&(resB->fResData), resB->fRes, inKey);
        const char* key = inKey;
        if(res == RES_BOGUS) {
            UResourceDataEntry *dataEntry = resB->fData;
            CharString path;
            char *myPath = NULL;
            const char* resPath = resB->fResPath;
            int32_t len = resB->fResPathLen;
            while(res == RES_BOGUS && dataEntry->fParent != NULL) { /* Otherwise, we'll look in parents */
                dataEntry = dataEntry->fParent;
                rootRes = dataEntry->fData.rootRes;

                if(dataEntry->fBogus == U_ZERO_ERROR) {
                    path.clear();
                    if (len > 0) {
                        path.append(resPath, len, *status);
                    }
                    path.append(inKey, *status);
                    if (U_FAILURE(*status)) {
                        ures_close(helper);
                        return fillIn;
                    }
                    myPath = path.data();
                    key = inKey;
                    do {
                        res = res_findResource(&(dataEntry->fData), rootRes, &myPath, &key);
                        if (RES_GET_TYPE(res) == URES_ALIAS && *myPath) {
                            /* We hit an alias, but we didn't finish following the path. */
                            helper = init_resb_result(&(dataEntry->fData), res, NULL, -1, dataEntry, resB, 0, helper, status); 
                            /*helper = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, helper, status);*/
                            if(helper) {
                              dataEntry = helper->fData;
                              rootRes = helper->fRes;
                              resPath = helper->fResPath;
                              len = helper->fResPathLen;

                            } else {
                              break;
                            }
                        }
                    } while(*myPath); /* Continue until the whole path is consumed */
                }
            }
            /*const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);*/
            if(res != RES_BOGUS) {
              /* check if resB->fResPath gives the right name here */
                if(uprv_strcmp(dataEntry->fName, uloc_getDefault())==0 || uprv_strcmp(dataEntry->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }

                fillIn = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, fillIn, status);
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            fillIn = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    ures_close(helper);
    return fillIn;
}